

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projector.h
# Opt level: O2

void __thiscall Projector::Projector(Projector *this,ofstream *myFile)

{
  ostream *poVar1;
  
  this->LED = false;
  (this->CurrentImageLoc)._M_dataplus._M_p = (pointer)&(this->CurrentImageLoc).field_2;
  (this->CurrentImageLoc)._M_string_length = 0;
  (this->CurrentImageLoc).field_2._M_local_buf[0] = '\0';
  cv::Mat::Mat(&this->CurrentImage);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"PROJECTOR INITIALIZED!");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)myFile);
  poVar1 = std::operator<<(poVar1,"PROJECTOR INITIALIZED!");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

Projector::Projector(ofstream &myFile)
{
	//Initializez Projector

	cout << endl << "PROJECTOR INITIALIZED!" << endl << endl;
	myFile << endl << "PROJECTOR INITIALIZED!" << endl << endl;
}